

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

int Scl_LibertyReadCellIsFlop(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Scl_Item_t *pSVar7;
  
  uVar1 = pCell->Child;
  iVar2 = p->nItems;
  if ((int)uVar1 < iVar2) {
    if ((-1 < (int)uVar1) && (p->pItems != (Scl_Item_t *)0x0)) {
      pSVar7 = p->pItems + uVar1;
      pcVar3 = p->pContents;
      do {
        iVar6 = (pSVar7->Key).Beg;
        iVar4 = (pSVar7->Key).End - iVar6;
        iVar5 = strncmp(pcVar3 + iVar6,"ff",(long)iVar4);
        if (iVar4 == 2 && iVar5 == 0) {
          return 1;
        }
        iVar6 = strncmp(pcVar3 + iVar6,"latch",(long)iVar4);
        if ((iVar4 == 5) && (iVar6 == 0)) {
          return 1;
        }
        uVar1 = pSVar7->Next;
        if (iVar2 <= (int)uVar1) goto LAB_00464f4d;
      } while ((-1 < (int)uVar1) && (pSVar7 = p->pItems + uVar1, p->pItems != (Scl_Item_t *)0x0));
    }
    return 0;
  }
LAB_00464f4d:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                ,0x4d,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

int Scl_LibertyReadCellIsFlop( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pAttr;
    Scl_ItemForEachChild( p, pCell, pAttr )
        if ( !Scl_LibertyCompare(p, pAttr->Key, "ff") ||
             !Scl_LibertyCompare(p, pAttr->Key, "latch") )
            return 1;
    return 0;
}